

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::ConvertEntropyToMnemonicResponse::ConvertEntropyToMnemonicResponse
          (ConvertEntropyToMnemonicResponse *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::ConvertEntropyToMnemonicResponse>).
  _vptr_JsonClassBase = (_func_int **)&PTR__ConvertEntropyToMnemonicResponse_00a86738;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mnemonic_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mnemonic_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mnemonic_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mnemonic_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_JsonVector = (_func_int **)&PTR__JsonVector_00a863e0;
  CollectFieldName();
  return;
}

Assistant:

ConvertEntropyToMnemonicResponse() {
    CollectFieldName();
  }